

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  size_t sVar2;
  runtime_error *prVar3;
  ParseLocation *this_00;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *this_01;
  _func_int **pp_Var4;
  long *in_RDX;
  Node *in_RDI;
  TransformNode *tnode;
  Ref<embree::SceneGraph::Node> child;
  size_t i_1;
  avector<AffineSpace3ff> spaces;
  bool quaternion;
  Ref<embree::XML> *in_stack_00000258;
  XMLLoader *in_stack_00000260;
  size_t i_3;
  XMLLoader *in_stack_00000498;
  size_t i_2;
  size_t i;
  Ref<embree::XML> *in_stack_000013c8;
  XMLLoader *in_stack_000013d0;
  char *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  undefined1 *puVar5;
  Ref<embree::SceneGraph::Node> *child_00;
  avector<AffineSpace3ff> *in_stack_fffffffffffffb18;
  TransformNode *in_stack_fffffffffffffb20;
  ParseLocation *in_stack_fffffffffffffb78;
  long *local_438;
  undefined1 local_429;
  string local_408 [32];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [24];
  undefined1 *local_320;
  undefined1 local_318 [8];
  ulong local_310;
  ulong local_308;
  void *local_300;
  byte local_2f6;
  undefined1 local_2f5;
  string local_2c8 [32];
  long *local_2a8;
  long *local_290;
  long *local_288;
  long *local_280;
  long *local_278;
  const_reference local_270;
  long *local_268;
  long *local_260;
  const_reference local_258;
  long *local_250;
  long *local_248;
  long *local_240;
  long *local_238;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined1 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  _func_int **local_198;
  long **local_188;
  ulong local_178;
  undefined1 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined1 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  ulong local_98;
  undefined1 *local_90;
  ulong local_88;
  void *local_80;
  undefined1 *local_78;
  ulong local_58;
  ulong local_50;
  undefined1 *local_48;
  void *local_40;
  ulong local_38;
  undefined1 *local_30;
  void *local_28;
  long local_20;
  long local_18;
  void *local_10;
  long local_8;
  
  local_2a8 = in_RDX;
  sVar2 = XML::size((XML *)0x3b39f2);
  if (sVar2 < 2) {
    local_2f5 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_238 = local_2a8;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffb78);
    std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
    std::runtime_error::runtime_error(prVar3,local_2c8);
    local_2f5 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2f6 = 0;
  local_240 = local_2a8;
  sVar2 = XML::size((XML *)0x3b3b51);
  local_178 = sVar2 - 1;
  local_170 = local_318;
  local_310 = 0;
  local_308 = 0;
  local_300 = (void *)0x0;
  local_50 = local_178;
  local_48 = local_170;
  if (local_178 != 0) {
    local_38 = local_178;
    local_30 = local_170;
    local_300 = alignedMalloc((size_t)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      local_40 = (void *)((long)local_300 + local_58 * 0x40);
      local_18 = (long)local_40 + 0x10;
      local_20 = (long)local_40 + 0x20;
      local_8 = (long)local_40 + 0x30;
      local_28 = local_40;
      local_10 = local_40;
    }
    local_308 = local_50;
  }
  local_320 = (undefined1 *)0x0;
  local_310 = local_308;
  do {
    puVar5 = local_320;
    local_248 = local_2a8;
    this_00 = (ParseLocation *)XML::size((XML *)0x3b3d1b);
    if ((undefined1 *)((long)&this_00[-1].colNumber + 7U) <= puVar5) {
      local_288 = local_2a8;
      child_00 = (Ref<embree::SceneGraph::Node> *)*local_2a8;
      this_01 = (vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                (child_00 + 0x10);
      local_290 = local_2a8;
      sVar2 = XML::size((XML *)0x3b4478);
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                (this_01,sVar2 - 1);
      loadNode(in_stack_000013d0,in_stack_000013c8);
      pp_Var4 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3b44b5);
      SceneGraph::TransformNode::TransformNode
                (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,child_00);
      *(byte *)(pp_Var4 + 0x12) = local_2f6 & 1;
      (in_RDI->super_RefCount)._vptr_RefCount = pp_Var4;
      local_198 = pp_Var4;
      if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
      }
      local_188 = &local_438;
      if (local_438 != (long *)0x0) {
        (**(code **)(*local_438 + 0x18))();
      }
      puVar5 = local_318;
      for (local_98 = 0; local_98 < local_310; local_98 = local_98 + 1) {
      }
      local_88 = local_308;
      local_80 = local_300;
      local_1c8 = puVar5;
      local_90 = puVar5;
      local_78 = puVar5;
      alignedFree(in_stack_fffffffffffffac8);
      *(undefined8 *)(puVar5 + 0x18) = 0;
      *(undefined8 *)(puVar5 + 0x10) = 0;
      *(undefined8 *)(puVar5 + 8) = 0;
      return (Ref<embree::SceneGraph::Node>)in_RDI;
    }
    local_250 = local_2a8;
    local_258 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            *)(*local_2a8 + 0x80),0);
    bVar1 = std::operator==(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    if (bVar1) {
      local_260 = local_2a8;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_2a8 + 0x80),(size_type)local_320);
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                (in_stack_00000498,(Ref<embree::XML> *)i_3);
      local_1e0 = &local_368;
      local_1e8 = &local_3a8;
      local_368 = local_3a8;
      uStack_360 = uStack_3a0;
      local_c0 = local_358;
      local_c8 = &local_398;
      local_d0 = local_348;
      local_d8 = &local_388;
      local_e0 = local_338;
      local_e8 = &local_378;
      local_1a0 = local_318;
      local_1a8 = local_320;
      local_210 = (undefined8 *)((long)local_300 + (long)local_320 * 0x40);
      local_218 = &local_368;
      *local_210 = local_3a8;
      local_210[1] = uStack_3a0;
      local_148 = local_358;
      local_140 = local_210 + 2;
      *local_140 = local_398;
      local_210[3] = uStack_390;
      local_158 = local_348;
      local_150 = local_210 + 4;
      *local_150 = local_388;
      local_210[5] = uStack_380;
      local_208 = local_338;
      local_200 = local_210 + 6;
      *local_200 = local_378;
      local_210[7] = uStack_370;
      local_1d8 = local_1e8;
      local_1d0 = local_1e0;
      local_168 = local_218;
      local_160 = local_210;
      local_138 = local_218;
      local_130 = local_210;
      local_b8 = local_1e8;
      local_b0 = local_1e0;
    }
    else {
      local_268 = local_2a8;
      local_270 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ::operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                *)(*local_2a8 + 0x80),0);
      bVar1 = std::operator==(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      if (!bVar1) {
        local_429 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_280 = local_2a8;
        ParseLocation::str_abi_cxx11_(this_00);
        std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
        std::runtime_error::runtime_error(prVar3,local_408);
        local_429 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_278 = local_2a8;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_2a8 + 0x80),(size_type)local_320);
      loadQuaternion(in_stack_00000260,in_stack_00000258);
      local_1b0 = local_318;
      local_1b8 = local_320;
      local_220 = (undefined8 *)((long)local_300 + (long)local_320 * 0x40);
      local_228 = &local_3e8;
      *local_220 = local_3e8;
      local_220[1] = uStack_3e0;
      local_108 = &local_3d8;
      local_100 = local_220 + 2;
      *local_100 = local_3d8;
      local_220[3] = uStack_3d0;
      local_118 = &local_3c8;
      local_110 = local_220 + 4;
      *local_110 = local_3c8;
      local_220[5] = uStack_3c0;
      local_1f8 = &local_3b8;
      local_1f0 = local_220 + 6;
      *local_1f0 = local_3b8;
      local_220[7] = uStack_3b0;
      local_2f6 = 1;
      local_128 = local_228;
      local_120 = local_220;
      local_f8 = local_228;
      local_f0 = local_220;
    }
    local_320 = local_320 + 1;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() < 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid TransformAnimation node");

    bool quaternion = false;
    avector<AffineSpace3ff> spaces(xml->size()-1);
    for (size_t i=0; i<xml->size()-1; i++)
    {
      if (xml->children[0]->name == "AffineSpace") {
        spaces[i] = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
      }
      else if (xml->children[0]->name == "Quaternion") {
        spaces[i] = loadQuaternion(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }

    Ref<SceneGraph::Node> child = loadNode(xml->children[xml->size()-1]);
    auto tnode = new SceneGraph::TransformNode(spaces,child);
    tnode->spaces.quaternion = quaternion;
    return tnode;
  }